

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

QTableWidgetItem * __thiscall QTableModel::item(QTableModel *this,QModelIndex *index)

{
  bool bVar1;
  QTableWidgetItem *pQVar2;
  
  bVar1 = isValid(this,index);
  if (bVar1) {
    pQVar2 = (this->tableItems).d.ptr
             [(long)index->r * (this->horizontalHeaderItems).d.size + (long)index->c];
  }
  else {
    pQVar2 = (QTableWidgetItem *)0x0;
  }
  return pQVar2;
}

Assistant:

QTableWidgetItem *QTableModel::item(const QModelIndex &index) const
{
    if (!isValid(index))
        return nullptr;
    return tableItems.at(tableIndex(index.row(), index.column()));
}